

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSecondaryViewConfigurationLayerInfoMSFT *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrEnvironmentBlendMode XVar3;
  XrStructureType XVar4;
  XrCompositionLayerEquirect2KHR *value_00;
  char cVar5;
  bool bVar6;
  char cVar7;
  NextChainResult NVar8;
  pointer pcVar9;
  long lVar10;
  uint uVar11;
  XrResult XVar12;
  ulong uVar13;
  uint __val;
  string out;
  string local_3a8;
  string error_message;
  ios_base local_318 [264];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_210;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_188;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_170;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_158;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_140;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_128;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_110;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_98;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_80;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar12 = XR_SUCCESS;
  if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSecondaryViewConfigurationLayerInfoMSFT",
               value->type,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type",
               XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT,
               "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
    XVar12 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    NVar8 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar8 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      local_210 = objects_info;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ","");
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&out,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
      paVar1 = &out.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_98,local_210);
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a8,
                 "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct"
                 ,"");
      CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_98
                          ,&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if (local_98.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
      XVar12 = XR_ERROR_VALIDATION_FAILURE;
      objects_info = local_210;
    }
    else if (NVar8 == NEXT_CHAIN_RESULT_ERROR) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next"
                 ,"");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_80,objects_info);
      out._M_dataplus._M_p = (pointer)&out.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,
                 "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\""
                 ,"");
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,&local_80,&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if (local_80.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
      XVar12 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(duplicate_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (!check_members || XVar12 != XR_SUCCESS) {
    return XVar12;
  }
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&error_message,"XrSecondaryViewConfigurationLayerInfoMSFT","");
  paVar1 = &out.field_2;
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"viewConfigurationType","");
  bVar6 = ValidateXrEnum(instance_info,command_name,&error_message,&out,objects_info,
                         value->viewConfigurationType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,
               "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value "
               ,0x76);
    local_3a8._M_dataplus._M_p._0_4_ = value->viewConfigurationType;
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&out,'\n');
    *out._M_dataplus._M_p = '0';
    out._M_dataplus._M_p[1] = 'x';
    pcVar9 = out._M_dataplus._M_p +
             CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length) + -1;
    lVar10 = 0;
    do {
      bVar2 = *(byte *)((long)&local_3a8._M_dataplus._M_p + lVar10);
      *pcVar9 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar9[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar10 = lVar10 + 1;
      pcVar9 = pcVar9 + -2;
    } while (lVar10 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,out._M_dataplus._M_p,
               CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b0,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_b0,
                        &local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
LAB_00192a82:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    std::ios_base::~ios_base(local_318);
    return XR_ERROR_VALIDATION_FAILURE;
  }
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&error_message,"XrSecondaryViewConfigurationLayerInfoMSFT","");
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"environmentBlendMode","");
  XVar3 = value->environmentBlendMode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  if (2 < XVar3 - XR_ENVIRONMENT_BLEND_MODE_OPAQUE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,
               "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value "
               ,0x74);
    local_3a8._M_dataplus._M_p._0_4_ = value->environmentBlendMode;
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&out,'\n');
    *out._M_dataplus._M_p = '0';
    out._M_dataplus._M_p[1] = 'x';
    pcVar9 = out._M_dataplus._M_p +
             CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length) + -1;
    lVar10 = 0;
    do {
      bVar2 = *(byte *)((long)&local_3a8._M_dataplus._M_p + lVar10);
      *pcVar9 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar9[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar10 = lVar10 + 1;
      pcVar9 = pcVar9 + -2;
    } while (lVar10 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,out._M_dataplus._M_p,
               CONCAT44(out._M_string_length._4_4_,(uint)out._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_c8,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_c8,
                        &local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00192a82;
  }
  XVar12 = XR_SUCCESS;
  if ((value->layerCount == 0) && (value->layers != (XrCompositionLayerBaseHeader **)0x0)) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_e0,objects_info);
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0"
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_e0,&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if (local_e0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
    XVar12 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
    if (value->layerCount == 0) {
      return XVar12;
    }
    uVar13 = 0;
    do {
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layers[uVar13];
      __val = (uint)uVar13;
      if (value_00 == (XrCompositionLayerEquirect2KHR *)0x0) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::to_string(&out,__val);
        std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::append((char *)&error_message);
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                   "");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_110,objects_info);
        CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_110,&error_message);
        goto joined_r0x00192c49;
      }
      XVar4 = value_00->type;
      if ((int)XVar4 < 0x3b9b1050) {
        if ((int)XVar4 < 0x3b9ae170) {
          if (XVar4 == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
            XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                      (XrCompositionLayerProjection *)value_00);
            if (XVar12 != XR_SUCCESS) {
              error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
              std::__cxx11::string::append((char *)&error_message);
              cVar7 = '\x01';
              if (uVar13 < 10) goto LAB_00193394;
              cVar5 = '\x04';
              goto LAB_00192ce4;
            }
          }
          else if (XVar4 == XR_TYPE_COMPOSITION_LAYER_QUAD) {
            XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                      (XrCompositionLayerQuad *)value_00);
            if (XVar12 != XR_SUCCESS) {
              error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
              std::__cxx11::string::append((char *)&error_message);
              cVar7 = '\x01';
              if (uVar13 < 10) goto LAB_00193550;
              cVar5 = '\x04';
              goto LAB_00192fee;
            }
          }
          else {
LAB_0019275d:
            XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                                      (XrCompositionLayerBaseHeader *)value_00);
            if (XVar12 != XR_SUCCESS) {
              error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,
                         "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_1e8,objects_info);
              out._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&out,
                         "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid"
                         ,"");
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,&local_1e8,&out);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != paVar1) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              if (local_1e8.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1e8.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_1e8.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1e8.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_message._M_dataplus._M_p != &error_message.field_2) {
                operator_delete(error_message._M_dataplus._M_p,
                                error_message.field_2._M_allocated_capacity + 1);
                return XVar12;
              }
              return XVar12;
            }
          }
        }
        else if (XVar4 == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
          XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                    (XrCompositionLayerCubeKHR *)value_00);
          if (XVar12 != XR_SUCCESS) {
            error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,
                       "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
            std::__cxx11::string::append((char *)&error_message);
            cVar7 = '\x01';
            if (uVar13 < 10) goto LAB_00193472;
            cVar5 = '\x04';
            goto LAB_00192e69;
          }
        }
        else {
          if (XVar4 != XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) goto LAB_0019275d;
          XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                    (XrCompositionLayerCylinderKHR *)value_00);
          if (XVar12 != XR_SUCCESS) {
            error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,
                       "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
            std::__cxx11::string::append((char *)&error_message);
            cVar7 = '\x01';
            if (uVar13 < 10) goto LAB_0019362e;
            cVar5 = '\x04';
            goto LAB_0019307b;
          }
        }
      }
      else if ((int)XVar4 < 0x3b9c96f3) {
        if (XVar4 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
          XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                    (XrCompositionLayerEquirectKHR *)value_00);
          if (XVar12 != XR_SUCCESS) {
            error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,
                       "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
            std::__cxx11::string::append((char *)&error_message);
            std::__cxx11::to_string(&out,__val);
            std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)out._M_dataplus._M_p != paVar1) {
              operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&error_message);
            std::__cxx11::string::append((char *)&error_message);
            out._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&out,
                       "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_188,objects_info);
            CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                &local_188,&error_message);
            local_110.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_188.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_110.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_188.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            goto joined_r0x00192c49;
          }
        }
        else {
          if (XVar4 != XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) goto LAB_0019275d;
          XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,value_00);
          if (XVar12 != XR_SUCCESS) {
            error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,
                       "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
            std::__cxx11::string::append((char *)&error_message);
            std::__cxx11::to_string(&out,__val);
            std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)out._M_dataplus._M_p != paVar1) {
              operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&error_message);
            std::__cxx11::string::append((char *)&error_message);
            out._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&out,
                       "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_1a0,objects_info);
            CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                &local_1a0,&error_message);
            local_110.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_1a0.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_110.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1a0.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            goto joined_r0x00192c49;
          }
        }
      }
      else if (XVar4 == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
        XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                  (XrCompositionLayerPassthroughFB *)value_00);
        if (XVar12 != XR_SUCCESS) {
          error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,
                     "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&out,__val);
          std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar1) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          out._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,
                     "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_1b8,objects_info);
          CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_1b8,&error_message);
          local_110.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_1b8.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_110.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1b8.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          goto joined_r0x00192c49;
        }
      }
      else {
        if (XVar4 != XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) goto LAB_0019275d;
        XVar12 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                                  (XrCompositionLayerPassthroughHTC *)value_00);
        if (XVar12 != XR_SUCCESS) {
          error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,
                     "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers","");
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&out,__val);
          std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar1) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          out._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,
                     "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_1d0,objects_info);
          CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_1d0,&error_message);
          local_110.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_1d0.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_110.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1d0.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          goto joined_r0x00192c49;
        }
      }
      uVar13 = uVar13 + 1;
      if (value->layerCount <= uVar13) {
        return XR_SUCCESS;
      }
    } while( true );
  }
  if (value->layerCount == 0) {
    return XVar12;
  }
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&error_message,
             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_f8,objects_info);
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,
             "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not optional since \"layerCount\" is set and must be non-NULL"
             ,"");
  CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                      &local_f8,&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  if (local_f8.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00192c72;
  uVar13 = (long)local_f8.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)local_f8.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  goto LAB_00192c6d;
  while( true ) {
    if (uVar11 < 10000) goto LAB_00193472;
    uVar13 = (uVar13 & 0xffffffff) / 10000;
    cVar5 = cVar7 + '\x04';
    if (uVar11 < 100000) break;
LAB_00192e69:
    cVar7 = cVar5;
    uVar11 = (uint)uVar13;
    if (uVar11 < 100) {
      cVar7 = cVar7 + -2;
      goto LAB_00193472;
    }
    if (uVar11 < 1000) {
      cVar7 = cVar7 + -1;
      goto LAB_00193472;
    }
  }
  cVar7 = cVar7 + '\x01';
LAB_00193472:
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&out,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&error_message);
  std::__cxx11::string::append((char *)&error_message);
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_158,objects_info);
  CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_158,
                      &error_message);
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_158.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_158.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  goto joined_r0x00192c49;
  while( true ) {
    if (uVar11 < 10000) goto LAB_0019362e;
    uVar13 = (uVar13 & 0xffffffff) / 10000;
    cVar5 = cVar7 + '\x04';
    if (uVar11 < 100000) break;
LAB_0019307b:
    cVar7 = cVar5;
    uVar11 = (uint)uVar13;
    if (uVar11 < 100) {
      cVar7 = cVar7 + -2;
      goto LAB_0019362e;
    }
    if (uVar11 < 1000) {
      cVar7 = cVar7 + -1;
      goto LAB_0019362e;
    }
  }
  cVar7 = cVar7 + '\x01';
LAB_0019362e:
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&out,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&error_message);
  std::__cxx11::string::append((char *)&error_message);
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_170,objects_info);
  CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_170,
                      &error_message);
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_170.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_170.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  goto joined_r0x00192c49;
  while( true ) {
    if (uVar11 < 10000) goto LAB_00193394;
    uVar13 = (uVar13 & 0xffffffff) / 10000;
    cVar5 = cVar7 + '\x04';
    if (uVar11 < 100000) break;
LAB_00192ce4:
    cVar7 = cVar5;
    uVar11 = (uint)uVar13;
    if (uVar11 < 100) {
      cVar7 = cVar7 + -2;
      goto LAB_00193394;
    }
    if (uVar11 < 1000) {
      cVar7 = cVar7 + -1;
      goto LAB_00193394;
    }
  }
  cVar7 = cVar7 + '\x01';
LAB_00193394:
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&out,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&error_message);
  std::__cxx11::string::append((char *)&error_message);
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_128,objects_info);
  CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_128,
                      &error_message);
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_128.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  goto joined_r0x00192c49;
  while( true ) {
    if (uVar11 < 10000) goto LAB_00193550;
    uVar13 = (uVar13 & 0xffffffff) / 10000;
    cVar5 = cVar7 + '\x04';
    if (uVar11 < 100000) break;
LAB_00192fee:
    cVar7 = cVar5;
    uVar11 = (uint)uVar13;
    if (uVar11 < 100) {
      cVar7 = cVar7 + -2;
      goto LAB_00193550;
    }
    if (uVar11 < 1000) {
      cVar7 = cVar7 + -1;
      goto LAB_00193550;
    }
  }
  cVar7 = cVar7 + '\x01';
LAB_00193550:
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&out,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (out._M_dataplus._M_p,(uint)out._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&error_message);
  std::__cxx11::string::append((char *)&error_message);
  out._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter","");
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_140,objects_info);
  CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_140,
                      &error_message);
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_140.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_110.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_140.
       super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
joined_r0x00192c49:
  if (local_110.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar1) {
    uVar13 = out.field_2._M_allocated_capacity + 1;
    local_f8.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)out._M_dataplus._M_p;
LAB_00192c6d:
    operator_delete(local_f8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,uVar13);
  }
LAB_00192c72:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSecondaryViewConfigurationLayerInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSecondaryViewConfigurationLayerInfoMSFT",
                             value->type, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type", XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT, "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSecondaryViewConfigurationLayerInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrViewConfigurationType value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "viewConfigurationType", objects_info, value->viewConfigurationType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->viewConfigurationType));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrEnvironmentBlendMode value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "environmentBlendMode", objects_info, value->environmentBlendMode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->environmentBlendMode));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->layerCount && nullptr != value->layers) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->layers && 0 != value->layerCount) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not "
                            "optional since \"layerCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->layers) {
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            if (value->layers[value_layers_inc] == nullptr) {
                std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                error_message += "[";
                error_message += std::to_string(value_layers_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
            {
                const XrCompositionLayerProjection* const* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection* const*>(value->layers);
                if (new_compositionlayerprojection_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerprojection_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
            {
                const XrCompositionLayerQuad* const* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad* const*>(value->layers);
                if (new_compositionlayerquad_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerquad_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
            {
                const XrCompositionLayerCubeKHR* const* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR* const*>(value->layers);
                if (new_compositionlayercubekhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercubekhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
            {
                const XrCompositionLayerCylinderKHR* const* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR* const*>(value->layers);
                if (new_compositionlayercylinderkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercylinderkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
            {
                const XrCompositionLayerEquirectKHR* const* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR* const*>(value->layers);
                if (new_compositionlayerequirectkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirectkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
            {
                const XrCompositionLayerEquirect2KHR* const* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR* const*>(value->layers);
                if (new_compositionlayerequirect2khr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirect2khr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
            {
                const XrCompositionLayerPassthroughFB* const* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB* const*>(value->layers);
                if (new_compositionlayerpassthroughfb_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughfb_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
            {
                const XrCompositionLayerPassthroughHTC* const* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC* const*>(value->layers);
                if (new_compositionlayerpassthroughhtc_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughhtc_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate that the base-structure XrCompositionLayerBaseHeader is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, value->layers[value_layers_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}